

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O0

void ncnn::binary_op_vector_no_broadcast<ncnn::BinaryOp_x86_fma_functor::binary_op_rsub>
               (float *ptr,float *ptr1,float *outptr,int size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  int in_ECX;
  float *in_RDX;
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  __m128 _outp_1;
  __m128 _b_1;
  __m128 _p_1;
  __m256 _outp;
  __m256 _b;
  __m256 _p;
  int i;
  binary_op_rsub op;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  int local_194;
  float *local_188;
  undefined1 (*local_180) [32];
  undefined1 (*local_178) [32];
  
  local_188 = in_RDX;
  local_180 = in_RSI;
  local_178 = in_RDI;
  for (local_194 = 0; local_194 + 7 < in_ECX; local_194 = local_194 + 8) {
    auVar2 = vsubps_avx(*local_180,*local_178);
    local_200 = auVar2._0_8_;
    uStack_1f8 = auVar2._8_8_;
    uStack_1f0 = auVar2._16_8_;
    uStack_1e8 = auVar2._24_8_;
    *(undefined8 *)local_188 = local_200;
    *(undefined8 *)(local_188 + 2) = uStack_1f8;
    *(undefined8 *)(local_188 + 4) = uStack_1f0;
    *(undefined8 *)(local_188 + 6) = uStack_1e8;
    local_178 = local_178 + 1;
    local_180 = local_180 + 1;
    local_188 = local_188 + 8;
  }
  for (; local_194 + 3 < in_ECX; local_194 = local_194 + 4) {
    auVar1 = vsubps_avx(*(undefined1 (*) [16])*local_180,*(undefined1 (*) [16])*local_178);
    local_230 = auVar1._0_8_;
    uStack_228 = auVar1._8_8_;
    *(undefined8 *)local_188 = local_230;
    *(undefined8 *)(local_188 + 2) = uStack_228;
    local_178 = (undefined1 (*) [32])(*local_178 + 0x10);
    local_180 = (undefined1 (*) [32])(*local_180 + 0x10);
    local_188 = local_188 + 4;
  }
  for (; local_194 < in_ECX; local_194 = local_194 + 1) {
    *local_188 = *(float *)*local_180 - *(float *)*local_178;
    local_178 = (undefined1 (*) [32])(*local_178 + 4);
    local_180 = (undefined1 (*) [32])(*local_180 + 4);
    local_188 = local_188 + 1;
  }
  return;
}

Assistant:

static void binary_op_vector_no_broadcast(const float* ptr, const float* ptr1, float* outptr, int size)
{
    const Op op;

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _b = _mm512_loadu_ps(ptr1);
        __m512 _outp = op.func_pack16(_p, _b);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        ptr1 += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _b = _mm256_loadu_ps(ptr1);
        __m256 _outp = op.func_pack8(_p, _b);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        ptr1 += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _b = _mm_loadu_ps(ptr1);
        __m128 _outp = op.func_pack4(_p, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        ptr1 += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(*ptr, *ptr1);
        ptr += 1;
        ptr1 += 1;
        outptr += 1;
    }
}